

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::SchemaAttDef> *objToStore,XSerializeEngine *serEng)

{
  bool bVar1;
  SchemaAttDef *t;
  SchemaAttDef *serObj;
  SchemaAttDef *data;
  XMLSize_t i;
  XMLSize_t vectorLength;
  XSerializeEngine *serEng_local;
  RefVectorOf<xercesc_4_0::SchemaAttDef> *objToStore_local;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (SchemaAttDef *)
        BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::size
                  (&objToStore->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>);
    XSerializeEngine::writeSize(serEng,(XMLSize_t)t);
    for (data = (SchemaAttDef *)0x0; data < t;
        data = (SchemaAttDef *)
               ((long)&(data->super_XMLAttDef).super_XSerializable._vptr_XSerializable + 1)) {
      serObj = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                         (&objToStore->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,
                          (XMLSize_t)data);
      operator<<(serEng,(XSerializable *)serObj);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<SchemaAttDef>* const objToStore
                                    , XSerializeEngine&                serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {

        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            SchemaAttDef* data = objToStore->elementAt(i);
            serEng<<data;
        }

    }

}